

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

void __thiscall
Highs::getColsInterface
          (Highs *this,HighsIndexCollection *index_collection,HighsInt *num_col,double *cost,
          double *lower,double *upper,HighsInt *num_nz,HighsInt *start,HighsInt *index,double *value
          )

{
  HighsSparseMatrix *this_00;
  HighsInt data_dim;
  double *data0;
  double *data1;
  double *data2;
  bool bVar1;
  
  this_00 = &(this->model_).lp_.a_matrix_;
  bVar1 = HighsSparseMatrix::isColwise(this_00);
  data_dim = (this->model_).lp_.num_col_;
  data0 = (this->model_).lp_.col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
  data1 = (this->model_).lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
  data2 = (this->model_).lp_.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
  if (bVar1) {
    getSubVectors(index_collection,data_dim,data0,data1,data2,this_00,num_col,cost,lower,upper,
                  num_nz,start,index,value);
  }
  else {
    getSubVectorsTranspose
              (index_collection,data_dim,data0,data1,data2,this_00,num_col,cost,lower,upper,num_nz,
               start,index,value);
  }
  return;
}

Assistant:

void Highs::getColsInterface(const HighsIndexCollection& index_collection,
                             HighsInt& num_col, double* cost, double* lower,
                             double* upper, HighsInt& num_nz, HighsInt* start,
                             HighsInt* index, double* value) const {
  const HighsLp& lp = model_.lp_;
  if (lp.a_matrix_.isColwise()) {
    getSubVectors(index_collection, lp.num_col_, lp.col_cost_.data(),
                  lp.col_lower_.data(), lp.col_upper_.data(), lp.a_matrix_,
                  num_col, cost, lower, upper, num_nz, start, index, value);
  } else {
    getSubVectorsTranspose(index_collection, lp.num_col_, lp.col_cost_.data(),
                           lp.col_lower_.data(), lp.col_upper_.data(),
                           lp.a_matrix_, num_col, cost, lower, upper, num_nz,
                           start, index, value);
  }
}